

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O3

idx_t duckdb::UncompressedStringStorage::FinalizeAppend
                (ColumnSegment *segment,SegmentStatistics *param_2)

{
  ulong uVar1;
  __int_type _Var2;
  BlockManager *pBVar3;
  data_ptr_t pdVar4;
  undefined1 auVar5 [16];
  BufferManager *pBVar6;
  BlockHandle *pBVar7;
  idx_t iVar8;
  idx_t iVar9;
  ulong __n;
  BufferHandle handle;
  BufferHandle local_50;
  idx_t local_38;
  
  pBVar6 = BufferManager::GetBufferManager(segment->db);
  (*pBVar6->_vptr_BufferManager[7])(&local_50,pBVar6,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
  uVar1 = *(ulong *)((local_50.node.ptr)->buffer + segment->offset);
  _Var2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  pBVar3 = pBVar7->block_manager;
  iVar8 = optional_idx::GetIndex(&pBVar3->block_alloc_size);
  iVar9 = optional_idx::GetIndex(&pBVar3->block_header_size);
  __n = uVar1 & 0xffffffff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = iVar8 - iVar9;
  iVar8 = __n + _Var2 * 4 + 8;
  if (iVar8 < (SUB168(auVar5 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc)) {
    local_38 = ColumnSegment::SegmentSize(segment);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
    memmove((local_50.node.ptr)->buffer + _Var2 * 4 + 8,
            (local_50.node.ptr)->buffer + ((uVar1 >> 0x20) - __n),__n);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_50.node);
    pdVar4 = (local_50.node.ptr)->buffer;
    iVar9 = segment->offset;
    *(int *)(pdVar4 + iVar9) = (int)uVar1;
    *(int *)(pdVar4 + iVar9 + 4) = ((int)(uVar1 >> 0x20) + (int)iVar8) - (int)local_38;
  }
  else {
    iVar8 = ColumnSegment::SegmentSize(segment);
  }
  BufferHandle::~BufferHandle(&local_50);
  return iVar8;
}

Assistant:

idx_t UncompressedStringStorage::FinalizeAppend(ColumnSegment &segment, SegmentStatistics &) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto dict = GetDictionary(segment, handle);
	D_ASSERT(dict.end == segment.SegmentSize());
	// compute the total size required to store this segment
	auto offset_size = DICTIONARY_HEADER_SIZE + segment.count * sizeof(int32_t);
	auto total_size = offset_size + dict.size;

	CompressionInfo info(segment.GetBlockManager());
	if (total_size >= info.GetCompactionFlushLimit()) {
		// the block is full enough, don't bother moving around the dictionary
		return segment.SegmentSize();
	}

	// the block has space left: figure out how much space we can save
	auto move_amount = segment.SegmentSize() - total_size;
	// move the dictionary so it lines up exactly with the offsets
	auto dataptr = handle.Ptr();
	memmove(dataptr + offset_size, dataptr + dict.end - dict.size, dict.size);
	dict.end -= move_amount;
	D_ASSERT(dict.end == total_size);
	// write the new dictionary (with the updated "end")
	SetDictionary(segment, handle, dict);
	return total_size;
}